

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall kratos::DPIVisitor::visit(DPIVisitor *this,FunctionStmtBlock *stmt)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
  *this_00;
  mapped_type pDVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  mapped_type *ppDVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  StmtException *pSVar10;
  VarException *pVVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<kratos::IRNode_*> __l_02;
  basic_string_view<char> bVar12;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  FunctionStmtBlock *local_d8;
  mapped_type local_d0;
  long local_c8;
  FunctionStmtBlock *local_c0;
  key_type local_b8;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_98;
  mapped_type local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator_type local_31;
  
  iVar4 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])(stmt);
  if ((char)iVar4 != '\0') {
    std::__cxx11::string::string((string *)&local_b8,(string *)&stmt->function_name_);
    this_00 = &this->dpi_funcs_;
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
            ::find(&this_00->_M_t,&local_b8);
    if ((_Rb_tree_header *)iVar5._M_node == &(this->dpi_funcs_)._M_t._M_impl.super__Rb_tree_header)
    {
      local_78._M_dataplus._M_p =
           (pointer)__dynamic_cast(stmt,&FunctionStmtBlock::typeinfo,&DPIFunctionStmtBlock::typeinfo
                                   ,0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,kratos::DPIFunctionStmtBlock*>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>>>
                  *)this_00,&local_b8,(DPIFunctionStmtBlock **)&local_78);
    }
    else {
      ppDVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
                ::at(this_00,&local_b8);
      pDVar1 = *ppDVar6;
      if ((pDVar1->super_FunctionStmtBlock).ports_._M_t._M_impl.super__Rb_tree_header._M_node_count
          != (stmt->ports_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        pSVar10 = (StmtException *)__cxa_allocate_exception(0x10);
        std::operator+(&local_58,"DPI function ",&local_b8);
        std::operator+(&local_78,&local_58," has different interface");
        __l_02._M_len = 2;
        __l_02._M_array = (iterator)&local_d8;
        local_d8 = stmt;
        local_d0 = pDVar1;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_98,__l_02,&local_31);
        StmtException::StmtException(pSVar10,&local_78,&local_98);
        __cxa_throw(pSVar10,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      local_c8 = __dynamic_cast(stmt,&FunctionStmtBlock::typeinfo,&DPIFunctionStmtBlock::typeinfo,0)
      ;
      local_c0 = stmt;
      local_80 = pDVar1;
      for (p_Var9 = (pDVar1->super_FunctionStmtBlock).ports_._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left;
          (_Rb_tree_header *)p_Var9 !=
          &(pDVar1->super_FunctionStmtBlock).ports_._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                ::find(&(stmt->ports_)._M_t,(key_type *)(p_Var9 + 1));
        if ((_Rb_tree_header *)cVar7._M_node == &(stmt->ports_)._M_t._M_impl.super__Rb_tree_header)
        {
          pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
          local_58._M_dataplus._M_p = local_b8._M_dataplus._M_p;
          local_58._M_string_length = local_b8._M_string_length;
          bVar12 = fmt::v7::to_string_view<char,_0>
                             ("DPI function with the same name ({0}) have different interface");
          format_str_00.data_ = (char *)bVar12.size_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_58;
          format_str_00.size_ = 0xd;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_78,(detail *)bVar12.data_,format_str_00,args_00);
          local_98.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 2);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&local_98;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_58,__l_01,(allocator_type *)&local_d8);
          VarException::VarException
                    (pVVar11,&local_78,
                     (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_58);
          __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                 ::at(&stmt->ports_,(key_type *)(p_Var9 + 1));
        bVar3 = std::operator!=(&(((pmVar8->
                                   super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr)->super_Var).size_,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                (*(long *)(p_Var9 + 2) + 0xa0));
        if (bVar3) {
LAB_001f8ebf:
          pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
          local_58._M_dataplus._M_p = local_b8._M_dataplus._M_p;
          local_58._M_string_length = local_b8._M_string_length;
          bVar12 = fmt::v7::to_string_view<char,_0>
                             ("DPI function with the same name ({0}) have different interface");
          format_str.data_ = (char *)bVar12.size_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_58;
          format_str.size_ = 0xd;
          fmt::v7::detail::vformat_abi_cxx11_(&local_78,(detail *)bVar12.data_,format_str,args);
          local_98.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 2);
          local_98.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)(pmVar8->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr;
          __l_00._M_len = 2;
          __l_00._M_array = (iterator)&local_98;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_58,__l_00,(allocator_type *)&local_d8);
          VarException::VarException
                    (pVVar11,&local_78,
                     (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_58);
          __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        peVar2 = (pmVar8->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (((peVar2->super_Var).is_signed_ != (bool)*(char *)(*(long *)(p_Var9 + 2) + 0xf0)) ||
           (peVar2->direction_ != *(PortDirection *)(*(long *)(p_Var9 + 2) + 0x270)))
        goto LAB_001f8ebf;
      }
      if (((bool)*(char *)(local_c8 + 0x184) != local_80->is_context_) ||
         ((bool)*(char *)(local_c8 + 0x185) != local_80->is_pure_)) {
        pSVar10 = (StmtException *)__cxa_allocate_exception(0x10);
        std::operator+(&local_58,"DPI function ",&local_b8);
        std::operator+(&local_78,&local_58," has different attribute (pure/context)");
        local_d8 = local_c0;
        local_d0 = local_80;
        __l._M_len = 2;
        __l._M_array = (iterator)&local_d8;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_98,__l,&local_31);
        StmtException::StmtException(pSVar10,&local_78,&local_98);
        __cxa_throw(pSVar10,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return;
}

Assistant:

void visit(FunctionStmtBlock* stmt) override {
        if (!stmt->is_dpi()) return;
        // collect all the dpi information and then make sure they are declared in the same
        // name and spec
        // this can be an issue if the files are going to split into multiple files
        auto const& func_name = stmt->function_name();
        if (dpi_funcs_.find(func_name) == dpi_funcs_.end()) {
            // new one
            dpi_funcs_.emplace(func_name, dynamic_cast<DPIFunctionStmtBlock*>(stmt));
        } else {
            auto* ref_stmt = dpi_funcs_.at(func_name);
            auto const& ref_ports = ref_stmt->ports();
            auto const& ports = stmt->ports();
            if (ref_ports.size() != ports.size())
                throw StmtException("DPI function " + func_name + " has different interface",
                                    {stmt, ref_stmt});
            // check the return width
            auto* dpi_stmt = dynamic_cast<DPIFunctionStmtBlock*>(stmt);
            if (dpi_stmt->return_width() != ref_stmt->return_width()) {
                if (ref_ports.size() != ports.size())
                    throw StmtException("DPI function " + func_name + " has different interface",
                                        {stmt, ref_stmt});
            }
            for (auto const& [port_name, port_ref] : ref_ports) {
                if (ports.find(port_name) == ports.end()) {
                    throw VarException(
                        ::format("DPI function with the same name ({0}) have different interface",
                                 func_name),
                        {port_ref.get()});
                }
                auto const& port = ports.at(port_name);
                if (port->size() != port_ref->size() ||
                    port->is_signed() != port_ref->is_signed() ||
                    port->port_direction() != port_ref->port_direction()) {
                    throw VarException(
                        ::format("DPI function with the same name ({0}) have different interface",
                                 func_name),
                        {port_ref.get(), port.get()});
                }
            }
            if (dpi_stmt->is_context() != ref_stmt->is_context() ||
                dpi_stmt->is_pure() != ref_stmt->is_pure())
                throw StmtException(
                    "DPI function " + func_name + " has different attribute (pure/context)",
                    {stmt, ref_stmt});
        }
    }